

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O2

bool __thiscall S2EdgeCrosser::EdgeOrVertexCrossing(S2EdgeCrosser *this,S2Point *d)

{
  S2Point *c;
  bool bVar1;
  int iVar2;
  
  c = this->c_;
  iVar2 = CrossingSign(this,d);
  if (iVar2 < 0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (iVar2 == 0) {
      bVar1 = S2::VertexCrossing(this->a_,this->b_,c,d);
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

inline bool S2EdgeCrosser::EdgeOrVertexCrossing(const S2Point* d) {
  // We need to copy c_ since it is clobbered by CrossingSign().
  const S2Point* c = c_;
  int crossing = CrossingSign(d);
  if (crossing < 0) return false;
  if (crossing > 0) return true;
  return S2::VertexCrossing(*a_, *b_, *c, *d);
}